

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O2

int mainWithContext(int startArgumentIndex,int argc,char **argv)

{
  int iVar1;
  sysbvm_tuple_t sVar2;
  ulong uVar3;
  sysbvm_stackFrameLandingPadRecord_t topLevelFrame;
  
  memset(&topLevelFrame,0,0x100);
  topLevelFrame.type = SYSBVM_STACK_FRAME_RECORD_TYPE_LANDING_PAD;
  topLevelFrame.keepStackTrace = true;
  sysbvm_stackFrame_enterContext(context,(sysbvm_stackFrameRecord_t *)&topLevelFrame);
  iVar1 = _setjmp((__jmp_buf_tag *)topLevelFrame.jmpbuffer);
  if (iVar1 == 0) {
    doMain(startArgumentIndex,argc,argv);
    iVar1 = 0;
  }
  else {
    sVar2 = sysbvm_tuple_asString(context,topLevelFrame.exception);
    uVar3 = 0;
    if ((sVar2 & 0xf) == 0 && sVar2 != 0) {
      uVar3 = (ulong)*(uint *)(sVar2 + 0xc);
    }
    fprintf(_stderr,"Unhandled exception: %.*s\n",uVar3,sVar2 + 0x10);
    sysbvm_stackFrame_printStackTrace(context,topLevelFrame.stackTrace);
    iVar1 = 1;
  }
  sysbvm_stackFrame_leaveContext();
  return iVar1;
}

Assistant:

int mainWithContext(int startArgumentIndex, int argc, const char *argv[])
{
    sysbvm_stackFrameLandingPadRecord_t topLevelFrame = {
        .type = SYSBVM_STACK_FRAME_RECORD_TYPE_LANDING_PAD,
        .keepStackTrace = true
    };

    sysbvm_stackFrame_enterContext(context, (sysbvm_stackFrameRecord_t*)&topLevelFrame);
    int exitCode = 0;
    if(!_setjmp(topLevelFrame.jmpbuffer))
    {
        doMain(startArgumentIndex, argc, argv);
    }
    else
    {
        sysbvm_tuple_t errorString = sysbvm_tuple_asString(context, topLevelFrame.exception);
        fprintf(stderr, "Unhandled exception: " SYSBVM_STRING_PRINTF_FORMAT "\n", SYSBVM_STRING_PRINTF_ARG(errorString));
        sysbvm_stackFrame_printStackTrace(context, topLevelFrame.stackTrace);
        exitCode = 1;
    }

    sysbvm_stackFrame_leaveContext();
    return exitCode;
}